

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

uint16_t __thiscall AmpIO::ReadMotorControlMode(AmpIO *this,uint index)

{
  BasePort *pBVar1;
  undefined4 local_18;
  uint local_14;
  uint32_t read_data;
  uint index_local;
  AmpIO *this_local;
  
  local_18 = 0;
  if ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0) {
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    local_14 = index;
    _read_data = this;
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
               (ulong)((index + 1) * 0x10 | 0x9000),&local_18);
  }
  return (uint16_t)local_18;
}

Assistant:

uint16_t AmpIO::ReadMotorControlMode(unsigned int index) const
{
    uint32_t read_data = 0;
    if (port)
        port->ReadQuadlet(BoardId, ADDR_MOTOR_CONTROL << 12 | (index + 1) << 4 | OFF_MOTOR_CONTROL_MODE, read_data);
    return read_data;
}